

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ground_plane.cpp
# Opt level: O3

void __thiscall polyscope::render::GroundPlane::draw(GroundPlane *this,bool isRedraw)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined4 uVar3;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  undefined8 **ppuVar9;
  ulong uVar10;
  float *pfVar11;
  bool bVar12;
  char *__end;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar49;
  undefined8 uVar48;
  float fVar50;
  double dVar51;
  float fVar54;
  undefined1 auVar52 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar55 [12];
  undefined1 auVar57 [56];
  undefined1 extraout_var [56];
  undefined1 auVar53 [64];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  float fVar65;
  float fVar67;
  undefined1 auVar66 [16];
  float fVar68;
  undefined1 auVar71 [12];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_ZMM9 [64];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar83;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_ZMM18 [64];
  vec4 vVar88;
  vec3 vVar89;
  type m;
  size_type __dnew;
  mat4 origViewMat;
  int local_39c;
  undefined8 local_390;
  undefined1 local_388 [16];
  undefined8 local_348;
  float afStack_340 [11];
  uint uStack_314;
  float fStack_310;
  float local_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined1 local_1fc;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined1 local_1dc;
  undefined1 local_1d8 [16];
  undefined6 *local_1c8;
  undefined8 local_1c0;
  undefined6 local_1b8;
  undefined2 uStack_1b2;
  undefined6 uStack_1b0;
  undefined1 local_1aa;
  undefined6 **local_1a8;
  undefined6 *local_1a0;
  undefined6 *local_198 [2];
  undefined1 local_188 [16];
  undefined5 *local_178;
  undefined8 local_170;
  undefined5 local_168;
  undefined3 uStack_163;
  undefined5 uStack_160;
  undefined1 local_15b;
  undefined6 *local_158;
  undefined8 local_150;
  undefined6 local_148;
  undefined2 uStack_142;
  undefined6 uStack_140;
  undefined1 local_13a;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined5 *local_98;
  undefined8 local_90;
  undefined5 local_88;
  undefined3 uStack_83;
  undefined5 uStack_80;
  undefined1 local_7b;
  ulong local_78;
  undefined8 uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  ulong uStack_40;
  undefined1 auVar56 [60];
  
  auVar71 = in_ZMM9._4_12_;
  auVar18 = in_ZMM18._0_16_;
  if ((options::groundPlaneMode != 0) && (view::style != 2)) {
    if (this->groundPlanePrepared == false) {
      prepare(this);
    }
    if (view::upDir != this->groundPlaneViewCached) {
      populateGroundPlaneGeometry(this);
    }
    switch(view::upDir) {
    case YUp:
    case NegYUp:
      local_39c = 1;
      uVar10 = (ulong)(view::upDir - NegXUp < 3);
      fVar47 = *(float *)(&DAT_002a9c60 + uVar10 * 4);
      local_390 = 0x3f80000000000000;
      local_2b8 = ZEXT416((uint)fVar47);
      pfVar11 = (float *)((long)&state::boundingBox + 4);
      pfVar8 = (float *)((long)&DAT_004bad54 + 4);
      local_2c8 = ZEXT416(*(uint *)(&DAT_002a9c60 + uVar10 * 4));
      local_2a8._0_12_ = ZEXT812(0);
      local_2a8._12_4_ = 0;
      local_388 = ZEXT416(0) << 0x20;
      local_308 = local_388;
      local_2d8 = local_388;
      break;
    case ZUp:
    case NegZUp:
      local_390 = 0;
      local_39c = 2;
      uVar10 = (ulong)(view::upDir - NegXUp < 3);
      fVar47 = *(float *)(&DAT_002a9c60 + uVar10 * 4);
      pfVar11 = (float *)&DAT_004bad50;
      pfVar8 = (float *)&DAT_004bad5c;
      local_2a8 = ZEXT416(*(uint *)(&DAT_002a9c60 + uVar10 * 4));
      local_2c8 = vinsertps_avx(local_2a8,ZEXT416((uint)fVar47),0x1d);
      local_308 = SUB6416(ZEXT464(0x3f800000),0);
      local_388 = ZEXT816(0);
      local_2d8 = local_388;
      local_2b8 = local_388;
      break;
    default:
      local_39c = 0;
      fVar47 = *(float *)(&DAT_002a9c60 + (ulong)(view::upDir - NegXUp < 3) * 4);
      pfVar11 = (float *)&state::boundingBox;
      local_390 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      pfVar8 = (float *)&DAT_004bad54;
      local_2d8 = ZEXT416((uint)fVar47);
      local_2a8 = vinsertps_avx(SUB6416(ZEXT464(0x3f800000),0),local_2d8,0x1d);
      local_388 = SUB6416(ZEXT464(0x3f800000),0);
      local_2b8._0_12_ = ZEXT812(0);
      local_2b8._12_4_ = 0;
      local_2c8 = ZEXT416(0);
      local_308 = ZEXT416(0);
    }
    if (fVar47 != 1.0) {
      pfVar8 = pfVar11;
    }
    if (NAN(fVar47)) {
      pfVar8 = pfVar11;
    }
    auVar28._0_8_ = (double)*pfVar8;
    auVar28._8_8_ = in_XMM4_Qa;
    local_1d8 = ZEXT416((uint)fVar47);
    auVar37._0_8_ = (double)fVar47;
    auVar37._8_8_ = 0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         state::lengthScale * 0.0001 +
         (double)(float)((uint)(options::groundPlaneHeightFactor & 1) *
                         (int)(float)(state::lengthScale * (double)DAT_004bac64) +
                        (uint)!(bool)(options::groundPlaneHeightFactor & 1) * (int)DAT_004bac64);
    auVar28 = vfnmadd213sd_fma(auVar27,auVar37,auVar28);
    auVar57 = ZEXT856(auVar28._8_8_);
    dVar51 = auVar28._0_8_;
    vVar88 = Engine::getCurrentViewport(engine);
    auVar42._0_8_ = vVar88._8_8_;
    auVar42._8_56_ = auVar57;
    auVar28 = auVar42._0_16_;
    local_188 = auVar28;
    iVar6 = Engine::getSSAAFactor(engine);
    auVar55 = auVar28._4_12_;
    if (options::groundPlaneMode == 2 && !isRedraw) {
      lVar13 = 0;
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[0xb])
                (peVar1,(ulong)(uint)((view::bufferWidth * iVar6) / 2),
                 (ulong)(uint)((view::bufferHeight * iVar6) / 2));
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[10])
                (peVar1,0,0,(ulong)(uint)((view::bufferWidth * iVar6) / 2),
                 (ulong)(uint)((view::bufferHeight * iVar6) / 2));
      Engine::setCurrentPixelScaling(engine,(float)iVar6 * 0.5);
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      aVar4 = DAT_004b9af8;
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      uVar3 = view::bgColor._4_4_;
      (peVar1->clearColor).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)view::bgColor
      ;
      (peVar1->clearColor).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar3;
      (peVar1->clearColor).field_2 = aVar4;
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[4])();
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      pfVar11 = afStack_340;
      fVar47 = (float)local_1d8._0_4_ * local_390._4_4_;
      local_78 = view::viewMat;
      uStack_70 = DAT_004bd698;
      uStack_68 = DAT_004bd6a0;
      uStack_60 = DAT_004bd6a8;
      uStack_58 = DAT_004bd6b0;
      uStack_50 = DAT_004bd6b8;
      uStack_48 = DAT_004bd6c0;
      uStack_40 = DAT_004bd6c8;
      fVar75 = (float)local_1d8._0_4_ * (float)local_388._0_4_;
      fVar45 = (float)local_1d8._0_4_ * (float)local_308._0_4_;
      do {
        fVar58 = fVar45;
        if (((int)lVar13 != 2) && (fVar58 = fVar75, (int)lVar13 == 1)) {
          fVar58 = fVar47;
        }
        lVar13 = lVar13 + 1;
        auVar28 = vinsertps_avx(ZEXT416((uint)(fVar75 * fVar58)),ZEXT416((uint)(fVar47 * fVar58)),
                                0x10);
        uVar48 = vmovlps_avx(auVar28);
        *(undefined8 *)(pfVar11 + -2) = uVar48;
        fVar72 = (float)local_348;
        *pfVar11 = fVar45 * fVar58;
        pfVar11 = pfVar11 + 3;
      } while (lVar13 != 3);
      auVar29._4_4_ = afStack_340[1];
      auVar29._0_4_ = afStack_340[0];
      auVar29._8_4_ = afStack_340[2];
      auVar29._12_4_ = afStack_340[3];
      local_1f8 = (undefined8 *)((ulong)local_1f8 & 0xffffffff00000000);
      local_218 = (undefined8 *)((ulong)local_218 & 0xffffffff00000000);
      auVar28 = vinsertps_avx(auVar29,ZEXT416((uint)afStack_340[3]),0x10);
      local_348._0_4_ = 0.0;
      fVar47 = afStack_340[6] + afStack_340[6];
      auVar19._0_4_ = fVar72 + fVar72;
      auVar19._4_4_ = local_348._4_4_ + local_348._4_4_;
      auVar19._8_8_ = 0;
      auVar16._0_4_ = afStack_340[1] + afStack_340[1];
      auVar16._4_4_ = afStack_340[2] + afStack_340[2];
      auVar16._8_8_ = 0;
      auVar17._0_4_ = (float)afStack_340._16_8_ + (float)afStack_340._16_8_;
      auVar17._4_4_ = SUB84(afStack_340._16_8_,4) + SUB84(afStack_340._16_8_,4);
      auVar17._8_8_ = 0;
      auVar15._0_4_ = auVar28._0_4_ + auVar28._0_4_;
      auVar15._4_4_ = auVar28._4_4_ + auVar28._4_4_;
      auVar15._8_4_ = auVar28._8_4_ + auVar28._8_4_;
      auVar15._12_4_ = auVar28._12_4_ + auVar28._12_4_;
      auVar28 = vsubps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
      auVar27 = vsubps_avx(ZEXT816(0x3f80000000000000),auVar16);
      auVar37 = vsubps_avx(ZEXT816(0) << 0x20,auVar15);
      auVar29 = vsubps_avx(ZEXT816(0) << 0x20,auVar17);
      auVar20._0_4_ = (float)dVar51;
      auVar20._4_12_ = auVar71;
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar14 = vxorps_avx512vl(auVar20,auVar14);
      if (local_39c == 2) {
        ppuVar9 = &local_218;
      }
      else if (local_39c == 1) {
        ppuVar9 = &local_1f8;
      }
      else {
        ppuVar9 = (undefined8 **)&local_348;
      }
      *(int *)ppuVar9 = auVar14._0_4_;
      auVar15 = vxorps_avx512vl(auVar18,auVar18);
      auVar69 = ZEXT816(0) << 0x40;
      auVar16 = vmulps_avx512vl(auVar37,auVar15);
      auVar17 = vmovshdup_avx512vl(auVar16);
      auVar19 = SUB6416(ZEXT464(0x80000000),0);
      auVar18 = vmulss_avx512f(ZEXT416((uint)(float)local_348),auVar19);
      auVar14 = vmulss_avx512f(ZEXT416((uint)local_1f8),auVar19);
      auVar19 = vmulss_avx512f(ZEXT416((uint)local_218),auVar19);
      auVar20 = vsubss_avx512f(auVar18,ZEXT416((uint)local_1f8));
      auVar21 = vsubss_avx512f(auVar14,ZEXT416((uint)(float)local_348));
      fVar75 = auVar18._0_4_ + auVar14._0_4_;
      fVar45 = auVar19._0_4_;
      auVar18 = vsubss_avx512f(ZEXT416((uint)fVar75),ZEXT416((uint)local_218));
      auVar22 = vaddss_avx512f(ZEXT416((uint)(fVar75 + fVar45)),SUB6416(ZEXT464(0x3f800000),0));
      auVar19 = vmulps_avx512vl(auVar28,auVar15);
      fVar75 = auVar21._0_4_ + fVar45 + 0.0;
      fVar45 = auVar20._0_4_ + fVar45 + 0.0;
      auVar21 = vaddss_avx512f(auVar18,auVar69);
      auVar14 = vmovshdup_avx(auVar19);
      fVar76 = fVar75 * 0.0;
      auVar23 = vmulss_avx512f(ZEXT416((uint)fVar45),auVar69);
      auVar18 = vhaddps_avx(auVar19,auVar19);
      auVar14 = vaddss_avx512f(ZEXT416((uint)(auVar28._0_4_ + auVar14._0_4_)),auVar16);
      auVar20 = vmovshdup_avx(auVar37);
      auVar24 = vaddss_avx512f(auVar18,auVar16);
      fVar58 = fVar76 + auVar14._0_4_;
      auVar25 = vmulps_avx512vl(auVar27,auVar15);
      auVar14 = vhaddps_avx(auVar25,auVar25);
      auVar26 = vmovshdup_avx512vl(auVar25);
      auVar19 = vinsertps_avx(auVar19,auVar25,0x1c);
      auVar28 = vinsertps_avx(auVar27,auVar28,0x4c);
      auVar27 = vaddss_avx512f(auVar27,auVar26);
      auVar26._0_4_ = auVar19._0_4_ + auVar28._0_4_;
      auVar26._4_4_ = auVar19._4_4_ + auVar28._4_4_;
      auVar26._8_4_ = auVar19._8_4_ + auVar28._8_4_;
      auVar26._12_4_ = auVar19._12_4_ + auVar28._12_4_;
      auVar19 = vbroadcastss_avx512vl(auVar23);
      auVar20 = vaddss_avx512f(auVar20,auVar14);
      auVar14 = vaddss_avx512f(auVar14,auVar17);
      auVar25 = vmulps_avx512vl(auVar29,auVar15);
      auVar28 = vaddss_avx512f(auVar27,auVar17);
      auVar27 = vaddps_avx512vl(auVar26,auVar16);
      auVar16 = vmovshdup_avx512vl(auVar25);
      auVar77 = ZEXT416((uint)fVar76);
      auVar17 = vaddss_avx512f(auVar28,auVar77);
      auVar26 = vaddss_avx512f(auVar29,auVar16);
      auVar28 = vmovshdup_avx(auVar29);
      auVar29 = vaddss_avx512f(auVar25,auVar16);
      auVar30 = ZEXT416((uint)(1.0 - fVar47));
      auVar16 = vmulss_avx512f(auVar30,auVar69);
      auVar26 = vaddss_avx512f(auVar26,auVar16);
      auVar30 = vaddss_avx512f(auVar30,auVar29);
      auVar29 = vaddss_avx512f(auVar29,auVar16);
      auVar28 = vaddss_avx512f(ZEXT416((uint)(auVar28._0_4_ + auVar25._0_4_)),auVar16);
      auVar16 = vmulss_avx512f(auVar17,auVar69);
      auVar25 = vaddss_avx512f(auVar26,auVar77);
      auVar26 = vmulss_avx512f(ZEXT416((uint)(float)local_348),auVar69);
      auVar31 = vmulss_avx512f(ZEXT416((uint)local_1f8),auVar69);
      auVar32 = vaddss_avx512f(auVar28,auVar23);
      auVar28 = vaddss_avx512f(auVar26,ZEXT416((uint)local_1f8));
      auVar33 = vaddss_avx512f(ZEXT416((uint)(float)local_348),auVar31);
      auVar26 = vaddss_avx512f(auVar26,auVar31);
      auVar31 = vmulss_avx512f(ZEXT416((uint)local_218),auVar69);
      auVar28 = vaddss_avx512f(auVar28,auVar31);
      auVar33 = vaddss_avx512f(auVar33,auVar31);
      auVar34 = vmulss_avx512f(auVar25,auVar69);
      auVar35 = vaddss_avx512f(ZEXT416((uint)local_218),auVar26);
      auVar26 = vaddss_avx512f(auVar26,auVar31);
      auVar31 = vmulss_avx512f(auVar32,auVar69);
      auVar33 = vaddss_avx512f(auVar33,auVar69);
      auVar73._0_4_ = auVar27._0_4_ + auVar19._0_4_;
      auVar73._4_4_ = auVar27._4_4_ + auVar19._4_4_;
      auVar73._8_4_ = auVar27._8_4_ + auVar19._8_4_;
      auVar73._12_4_ = auVar27._12_4_ + auVar19._12_4_;
      auVar27 = vaddss_avx512f(auVar26,SUB6416(ZEXT464(0x3f800000),0));
      auVar19 = vaddss_avx512f(ZEXT416((uint)fVar58),auVar16);
      fVar47 = auVar28._0_4_ + 0.0;
      fVar72 = auVar35._0_4_ + 0.0;
      auVar15 = vmulps_avx512vl(auVar73,auVar15);
      auVar26 = vmovshdup_avx512vl(auVar73);
      auVar35 = vaddss_avx512f(auVar17,ZEXT416((uint)(fVar58 * 0.0)));
      auVar19 = vaddss_avx512f(auVar34,auVar19);
      auVar16 = vaddss_avx512f(ZEXT416((uint)(fVar58 * 0.0)),auVar16);
      auVar28 = vmovshdup_avx(auVar15);
      auVar36 = vaddss_avx512f(auVar26,auVar15);
      auVar34 = vaddss_avx512f(auVar34,auVar35);
      auVar35 = vaddss_avx512f(auVar31,auVar36);
      auVar34 = vaddss_avx512f(auVar77,auVar34);
      auVar31 = vaddss_avx512f(auVar31,ZEXT416((uint)(auVar73._0_4_ + auVar28._0_4_)));
      auVar36 = vmulss_avx512f(auVar21,auVar69);
      auVar35 = vaddss_avx512f(auVar23,auVar35);
      auVar18 = vaddss_avx512f(ZEXT416((uint)(auVar37._0_4_ + auVar18._0_4_)),auVar36);
      auVar37 = vaddss_avx512f(auVar20,auVar36);
      auVar20 = vaddss_avx512f(auVar30,auVar36);
      auVar30 = vmulss_avx512f(auVar20,auVar69);
      auVar38 = vmulss_avx512f(auVar37,auVar69);
      auVar40 = ZEXT416((uint)(auVar18._0_4_ * 0.0));
      auVar39 = vaddss_avx512f(auVar37,auVar40);
      auVar40 = vaddss_avx512f(auVar40,auVar38);
      fVar76 = fVar76 + auVar19._0_4_;
      auVar19 = vaddss_avx512f(auVar18,auVar38);
      auVar38 = vaddss_avx512f(auVar30,auVar39);
      auVar39 = vmulss_avx512f(auVar22,auVar69);
      auVar24 = vaddss_avx512f(auVar39,ZEXT416(auVar24._0_4_));
      auVar19 = vaddss_avx512f(auVar30,auVar19);
      auVar14 = vaddss_avx512f(auVar14,auVar39);
      auVar29 = vaddss_avx512f(auVar39,ZEXT416(auVar29._0_4_));
      fVar46 = auVar14._0_4_ * 0.0;
      local_2f8 = ZEXT416((uint)fVar76);
      auVar16 = vaddss_avx512f(auVar25,auVar16);
      auVar16 = vaddss_avx512f(auVar77,auVar16);
      auVar19 = vaddss_avx512f(auVar36,auVar19);
      auVar30 = vaddss_avx512f(auVar23,ZEXT416(auVar31._0_4_));
      fVar50 = auVar29._0_4_;
      fVar49 = auVar24._0_4_ * 0.0;
      auVar29 = vmulss_avx512f(auVar33,auVar24);
      auVar31 = vaddss_avx512f(auVar14,ZEXT416((uint)fVar49));
      auVar28 = vaddss_avx512f(auVar23,ZEXT416((uint)(auVar32._0_4_ + auVar28._0_4_ + auVar15._0_4_)
                                              ));
      auVar15 = vaddss_avx512f(auVar20,auVar40);
      auVar23 = vaddss_avx512f(ZEXT416((uint)(fVar50 * 0.0)),auVar31);
      auVar31 = vaddss_avx512f(auVar36,auVar38);
      auVar24 = vaddss_avx512f(auVar39,ZEXT416((uint)(fVar50 * 0.0 + auVar24._0_4_ + fVar46)));
      auVar18 = vmulss_avx512f(auVar33,auVar18);
      fVar63 = auVar30._0_4_;
      auVar15 = vaddss_avx512f(auVar36,auVar15);
      local_2e8 = vaddss_avx512f(auVar39,auVar23);
      fVar68 = auVar24._0_4_;
      auVar23 = vmulss_avx512f(auVar33,auVar73);
      auVar24 = vaddss_avx512f(auVar39,ZEXT416((uint)(fVar50 + fVar49 + fVar46)));
      auVar30 = vmulss_avx512f(auVar33,ZEXT416((uint)fVar58));
      auVar26 = vmulss_avx512f(ZEXT416((uint)fVar47),auVar26);
      auVar37 = vmulss_avx512f(ZEXT416((uint)fVar47),auVar37);
      auVar22 = vmulss_avx512f(auVar27,ZEXT416(auVar22._0_4_));
      auVar25 = vmulss_avx512f(ZEXT416((uint)fVar72),auVar25);
      auVar21 = vmulss_avx512f(auVar27,ZEXT416(auVar21._0_4_));
      auVar20 = vmulss_avx512f(ZEXT416((uint)fVar72),auVar20);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = DAT_004bd6a0;
      auVar33 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar75));
      auVar27 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar45));
      fVar75 = auVar22._0_4_ + fVar50 * fVar72 + auVar29._0_4_ + auVar14._0_4_ * fVar47;
      fVar45 = auVar21._0_4_ + auVar20._0_4_ + auVar18._0_4_ + auVar37._0_4_;
      auVar18 = vbroadcastss_avx512vl(auVar28);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = DAT_004bd6b0;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = DAT_004bd6c0;
      fVar81 = view::viewMat._16_4_;
      fVar83 = view::viewMat._20_4_;
      auVar69._4_4_ = fVar45;
      auVar69._0_4_ = fVar45;
      auVar69._8_4_ = fVar45;
      auVar69._12_4_ = fVar45;
      auVar40._4_4_ = fVar75;
      auVar40._0_4_ = fVar75;
      auVar40._8_4_ = fVar75;
      auVar40._12_4_ = fVar75;
      auVar28 = vaddss_avx512f(auVar27,ZEXT416((uint)(auVar32._0_4_ * fVar72 +
                                                     auVar23._0_4_ + auVar26._0_4_)));
      auVar27 = vaddss_avx512f(auVar33,ZEXT416((uint)(auVar25._0_4_ +
                                                     auVar30._0_4_ + fVar47 * auVar17._0_4_)));
      auVar22._8_8_ = 0;
      auVar22._0_8_ = DAT_004bd6a8;
      auVar37 = vbroadcastss_avx512vl(auVar16);
      auVar29 = vmulps_avx512vl(auVar36,auVar40);
      fVar65 = (float)view::viewMat;
      fVar67 = view::viewMat._4_4_;
      auVar28 = vbroadcastss_avx512vl(auVar28);
      auVar14 = vbroadcastss_avx512vl(auVar15);
      auVar20 = vmulps_avx512vl(auVar39,auVar28);
      fVar47 = view::viewMat._32_4_;
      fVar58 = view::viewMat._36_4_;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = DAT_004bd6b8;
      auVar15 = vmulps_avx512vl(auVar77,auVar14);
      fVar46 = view::viewMat._8_4_;
      fVar49 = view::viewMat._12_4_;
      fVar50 = view::viewMat._24_4_;
      fVar54 = view::viewMat._28_4_;
      auVar28 = vmulps_avx512vl(auVar22,auVar28);
      auVar25._0_4_ = auVar14._0_4_ * fVar47 + fVar81 * auVar18._0_4_ + fVar65 * auVar37._0_4_;
      auVar25._4_4_ = auVar14._4_4_ * fVar58 + fVar83 * auVar18._4_4_ + fVar67 * auVar37._4_4_;
      auVar25._8_4_ = auVar14._8_4_ * 0.0 + auVar18._8_4_ * 0.0 + auVar37._8_4_ * 0.0;
      auVar25._12_4_ = auVar14._12_4_ * 0.0 + auVar18._12_4_ * 0.0 + auVar37._12_4_ * 0.0;
      auVar14 = vbroadcastss_avx512vl(auVar24);
      auVar16 = vmulps_avx512vl(auVar38,auVar69);
      auVar17 = vmulps_avx512vl(auVar77,auVar69);
      auVar21 = vmulps_avx512vl(auVar36,auVar14);
      auVar21 = vaddps_avx512vl(auVar21,auVar25);
      fVar45 = view::viewMat._56_4_;
      fVar72 = view::viewMat._60_4_;
      auVar23._0_4_ =
           auVar14._0_4_ * fVar45 + auVar15._0_4_ + fVar46 * auVar37._0_4_ + fVar50 * auVar18._0_4_;
      auVar23._4_4_ =
           auVar14._4_4_ * fVar72 + auVar15._4_4_ + fVar49 * auVar37._4_4_ + fVar54 * auVar18._4_4_;
      auVar23._8_4_ =
           auVar14._8_4_ * 0.0 + auVar15._8_4_ + auVar37._8_4_ * 0.0 + auVar18._8_4_ * 0.0;
      auVar23._12_4_ =
           auVar14._12_4_ * 0.0 + auVar15._12_4_ + auVar37._12_4_ * 0.0 + auVar18._12_4_ * 0.0;
      auVar18 = vbroadcastss_avx512vl(auVar27);
      auVar33._0_4_ = fVar65 * auVar18._0_4_;
      auVar33._4_4_ = fVar67 * auVar18._4_4_;
      auVar33._8_4_ = auVar18._8_4_ * 0.0;
      auVar33._12_4_ = auVar18._12_4_ * 0.0;
      auVar30._0_4_ = auVar18._0_4_ * fVar46;
      auVar30._4_4_ = auVar18._4_4_ * fVar49;
      auVar30._8_4_ = auVar18._8_4_ * 0.0;
      auVar30._12_4_ = auVar18._12_4_ * 0.0;
      auVar42 = vinsertf32x4_avx512f(ZEXT1664(auVar21),auVar23,1);
      auVar43 = vbroadcasti64x4_avx512f(_DAT_0029b3a0);
      auVar18 = vaddps_avx512vl(auVar33,auVar20);
      auVar28 = vaddps_avx512vl(auVar30,auVar28);
      auVar18 = vaddps_avx512vl(auVar16,auVar18);
      auVar32._0_4_ = fVar75 * fVar45 + auVar17._0_4_ + auVar28._0_4_;
      auVar32._4_4_ = fVar75 * fVar72 + auVar17._4_4_ + auVar28._4_4_;
      auVar32._8_4_ = fVar75 * 0.0 + auVar17._8_4_ + auVar28._8_4_;
      auVar32._12_4_ = fVar75 * 0.0 + auVar17._12_4_ + auVar28._12_4_;
      auVar18 = vaddps_avx512vl(auVar29,auVar18);
      auVar28 = vbroadcastss_avx512vl(auVar34);
      auVar44 = vinsertf32x4_avx512f(ZEXT1664(auVar18),auVar32,1);
      auVar42 = vpermi2pd_avx512f(auVar43,auVar42,auVar44);
      fVar75 = auVar19._0_4_;
      auVar18._4_4_ = fVar75;
      auVar18._0_4_ = fVar75;
      auVar18._8_4_ = fVar75;
      auVar18._12_4_ = fVar75;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = DAT_004bd6b8;
      auVar18 = vmulps_avx512vl(auVar34,auVar18);
      auVar27 = vbroadcastss_avx512vl(auVar35);
      auVar37 = vbroadcastss_avx512vl(auVar31);
      auVar24._0_4_ = fVar68 * fVar45 + auVar18._0_4_ + fVar76 * fVar46 + fVar50 * fVar63;
      auVar24._4_4_ = fVar68 * fVar72 + auVar18._4_4_ + fVar76 * fVar49 + fVar54 * fVar63;
      auVar24._8_4_ = fVar68 * 0.0 + auVar18._8_4_ + fVar76 * 0.0 + fVar63 * 0.0;
      auVar24._12_4_ = fVar68 * 0.0 + auVar18._12_4_ + fVar76 * 0.0 + fVar63 * 0.0;
      auVar18 = vmulps_avx512vl(auVar34,auVar37);
      auVar21._0_4_ =
           (float)local_2e8._0_4_ * fVar45 +
           auVar18._0_4_ + auVar28._0_4_ * fVar46 + auVar27._0_4_ * fVar50;
      auVar21._4_4_ =
           (float)local_2e8._0_4_ * fVar72 +
           auVar18._4_4_ + auVar28._4_4_ * fVar49 + auVar27._4_4_ * fVar54;
      auVar21._8_4_ =
           (float)local_2e8._0_4_ * 0.0 + auVar18._8_4_ + auVar28._8_4_ * 0.0 + auVar27._8_4_ * 0.0;
      auVar21._12_4_ =
           (float)local_2e8._0_4_ * 0.0 +
           auVar18._12_4_ + auVar28._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
      auVar43 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412(fVar68 * 0.0 +
                                              fVar75 * 0.0 + fVar63 * 0.0 + fVar76 * 0.0,
                                              CONCAT48(fVar68 * 0.0 +
                                                       fVar75 * 0.0 + fVar63 * 0.0 + fVar76 * 0.0,
                                                       CONCAT44(fVar68 * view::viewMat._52_4_ +
                                                                fVar75 * fVar58 +
                                                                fVar83 * fVar63 + fVar67 * fVar76,
                                                                fVar68 * view::viewMat._48_4_ +
                                                                fVar75 * fVar47 +
                                                                fVar81 * fVar63 + fVar65 * fVar76)))
                                   ),auVar24,1);
      auVar44 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412((float)local_2e8._0_4_ * 0.0 +
                                              auVar28._12_4_ * 0.0 + auVar27._12_4_ * 0.0 +
                                              auVar37._12_4_ * 0.0,
                                              CONCAT48((float)local_2e8._0_4_ * 0.0 +
                                                       auVar28._8_4_ * 0.0 + auVar27._8_4_ * 0.0 +
                                                       auVar37._8_4_ * 0.0,
                                                       CONCAT44((float)local_2e8._0_4_ *
                                                                view::viewMat._52_4_ +
                                                                fVar67 * auVar28._4_4_ +
                                                                fVar83 * auVar27._4_4_ +
                                                                auVar37._4_4_ * fVar58,
                                                                (float)local_2e8._0_4_ *
                                                                view::viewMat._48_4_ +
                                                                fVar65 * auVar28._0_4_ +
                                                                fVar81 * auVar27._0_4_ +
                                                                auVar37._0_4_ * fVar47)))),auVar21,1
                          );
      auVar41 = vpermi2pd_avx512vl(_DAT_0029b3c0,auVar43._0_32_,auVar44._0_32_);
      _viewMat = vinsertf64x4_avx512f(auVar42,auVar41,0);
      auVar55 = auVar43._4_12_;
      bVar5 = Engine::transparencyEnabled(engine);
      if (!bVar5) {
        drawStructures();
      }
      DAT_004bd698 = uStack_70;
      view::viewMat = local_78;
      DAT_004bd6a0 = uStack_68;
      DAT_004bd6a8 = uStack_60;
      DAT_004bd6b0 = uStack_58;
      DAT_004bd6b8 = uStack_50;
      DAT_004bd6c0 = uStack_48;
      DAT_004bd6c8 = uStack_40;
    }
    if ((!isRedraw) && (options::groundPlaneMode == 3)) {
      lVar13 = 0;
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[0xb])
                (peVar1,(ulong)(uint)(view::bufferWidth * iVar6),
                 (ulong)(uint)(view::bufferHeight * iVar6));
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[10])
                (peVar1,0,0,(ulong)(uint)(view::bufferWidth * iVar6),
                 (ulong)(uint)(view::bufferHeight * iVar6));
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      aVar4 = DAT_004b9af8;
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      uVar3 = view::bgColor._4_4_;
      (peVar1->clearColor).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)view::bgColor
      ;
      (peVar1->clearColor).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar3;
      (peVar1->clearColor).field_2 = aVar4;
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[4])();
      bVar5 = true;
      do {
        bVar12 = bVar5;
        peVar1 = (this->blurFrameBuffers)._M_elems[lVar13].
                 super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar1->_vptr_FrameBuffer[0xb])
                  (peVar1,(ulong)(uint)((view::bufferWidth * iVar6) / 2),
                   (ulong)(uint)((view::bufferHeight * iVar6) / 2));
        peVar1 = (this->blurFrameBuffers)._M_elems[lVar13].
                 super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar1->_vptr_FrameBuffer[10])
                  (peVar1,0,0,(ulong)(uint)((view::bufferWidth * iVar6) / 2),
                   (ulong)(uint)((view::bufferHeight * iVar6) / 2));
        (*((this->blurFrameBuffers)._M_elems[lVar13].
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_FrameBuffer[4])();
        lVar13 = 1;
        bVar5 = false;
      } while (bVar12);
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      local_348._0_4_ = 1.0;
      local_78 = view::viewMat;
      uStack_70 = DAT_004bd698;
      uStack_68 = DAT_004bd6a0;
      uStack_60 = DAT_004bd6a8;
      uStack_58 = DAT_004bd6b0;
      uStack_50 = DAT_004bd6b8;
      uStack_48 = DAT_004bd6c0;
      uStack_40 = DAT_004bd6c8;
      local_348._4_4_ = 0.0;
      afStack_340[0] = 0.0;
      afStack_340[1] = 0.0;
      afStack_340[2] = 0.0;
      afStack_340[3] = 1.0;
      afStack_340[4] = 0.0;
      afStack_340[5] = 0.0;
      afStack_340[6] = 0.0;
      afStack_340[7] = 0.0;
      afStack_340[8] = 1.0;
      afStack_340[9] = 0.0;
      afStack_340[10] = 0.0;
      _uStack_314 = 0;
      local_30c = 1.0;
      uVar10 = (ulong)(uint)(local_39c << 4);
      if (local_39c == 0) {
        pfVar11 = afStack_340 + 10;
        *(undefined4 *)((long)&local_348 + uVar10) = 0;
        fVar47 = 1.0;
        fVar75 = 0.0;
        fVar58 = 0.0;
        auVar18 = ZEXT816(0);
        fVar76 = 0.0;
        fVar46 = 1.0;
        fVar45 = afStack_340[6];
        fVar72 = afStack_340[2];
      }
      else if (local_39c == 2) {
        pfVar11 = afStack_340 + 0xc;
        *(undefined4 *)((long)afStack_340 + uVar10) = 0;
        auVar18 = ZEXT416((uint)afStack_340[0]);
        fVar47 = afStack_340[8];
        fVar75 = 0.0;
        fVar45 = 0.0;
        fVar58 = afStack_340[4];
        fVar72 = 0.0;
        fVar76 = 0.0;
        fVar46 = 1.0;
      }
      else {
        *(undefined4 *)((long)&local_348 + uVar10 + 4) = 0;
        fVar47 = 1.0;
        pfVar11 = afStack_340 + 0xb;
        fVar58 = 0.0;
        auVar18 = ZEXT816(0);
        fVar75 = afStack_340[7];
        fVar45 = 0.0;
        fVar72 = 0.0;
        fVar76 = local_348._4_4_;
        fVar46 = afStack_340[3];
      }
      auVar82._8_8_ = 0;
      auVar82._0_8_ = view::viewMat;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = DAT_004bd6a0;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = DAT_004bd6a8;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = DAT_004bd6b0;
      auVar80._4_4_ = (float)local_348;
      auVar80._0_4_ = (float)local_348;
      auVar80._8_4_ = (float)local_348;
      auVar80._12_4_ = (float)local_348;
      auVar78._4_4_ = fVar76;
      auVar78._0_4_ = fVar76;
      auVar78._8_4_ = fVar76;
      auVar78._12_4_ = fVar76;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = DAT_004bd6b8;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = DAT_004bd6c8;
      auVar74._4_4_ = fVar72;
      auVar74._0_4_ = fVar72;
      auVar74._8_4_ = fVar72;
      auVar74._12_4_ = fVar72;
      auVar59._4_4_ = fVar46;
      auVar59._0_4_ = fVar46;
      auVar59._8_4_ = fVar46;
      auVar59._12_4_ = fVar46;
      auVar61._4_4_ = fVar58;
      auVar61._0_4_ = fVar58;
      auVar61._8_4_ = fVar58;
      auVar61._12_4_ = fVar58;
      auVar31._4_4_ = fVar47;
      auVar31._0_4_ = fVar47;
      auVar31._8_4_ = fVar47;
      auVar31._12_4_ = fVar47;
      auVar28 = vmulps_avx512vl(auVar84,auVar78);
      auVar27 = vmulps_avx512vl(auVar82,auVar80);
      fVar65 = view::viewMat._24_4_;
      fVar68 = view::viewMat._28_4_;
      *pfVar11 = (float)dVar51;
      auVar28 = vaddps_avx512vl(auVar27,auVar28);
      auVar18 = vbroadcastss_avx512vl(auVar18);
      auVar27 = vmulps_avx512vl(auVar85,auVar18);
      auVar27 = vaddps_avx512vl(auVar28,auVar27);
      auVar28 = vxorps_avx512vl(auVar28,auVar28);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = DAT_004bd6c0;
      auVar37 = vmulps_avx512vl(auVar87,auVar28);
      fVar67 = view::viewMat._8_4_;
      fVar81 = view::viewMat._12_4_;
      auVar27 = vaddps_avx512vl(auVar27,auVar37);
      auVar18 = vmulps_avx512vl(auVar66,auVar18);
      auVar29 = vmulps_avx512vl(auVar84,auVar59);
      auVar28 = vmulps_avx512vl(auVar70,auVar28);
      auVar14 = vmulps_avx512vl(auVar82,auVar74);
      auVar29 = vaddps_avx512vl(auVar14,auVar29);
      auVar14 = vmulps_avx512vl(auVar85,auVar61);
      fVar49 = auVar28._0_4_;
      auVar79._0_4_ = (float)local_348 * fVar67 + fVar76 * fVar65 + auVar18._0_4_ + fVar49;
      fVar50 = auVar28._4_4_;
      auVar79._4_4_ = (float)local_348 * fVar81 + fVar76 * fVar68 + auVar18._4_4_ + fVar50;
      fVar54 = auVar28._8_4_;
      auVar79._8_4_ = (float)local_348 * 0.0 + fVar76 * 0.0 + auVar18._8_4_ + fVar54;
      fVar63 = auVar28._12_4_;
      auVar79._12_4_ = (float)local_348 * 0.0 + fVar76 * 0.0 + auVar18._12_4_ + fVar63;
      auVar18 = vaddps_avx512vl(auVar29,auVar14);
      auVar28 = vmulps_avx512vl(auVar85,auVar31);
      auVar62._0_4_ = view::viewMat._16_4_ * fVar75 + (float)view::viewMat * fVar45;
      auVar62._4_4_ = view::viewMat._20_4_ * fVar75 + view::viewMat._4_4_ * fVar45;
      auVar62._8_4_ = fVar75 * 0.0 + fVar45 * 0.0;
      auVar62._12_4_ = fVar75 * 0.0 + fVar45 * 0.0;
      auVar18 = vaddps_avx512vl(auVar18,auVar37);
      auVar60._0_4_ = fVar49 + fVar72 * fVar67 + fVar65 * fVar46 + view::viewMat._40_4_ * fVar58;
      auVar60._4_4_ = fVar50 + fVar72 * fVar81 + fVar68 * fVar46 + view::viewMat._44_4_ * fVar58;
      auVar60._8_4_ = fVar54 + fVar72 * 0.0 + fVar46 * 0.0 + fVar58 * 0.0;
      auVar60._12_4_ = fVar63 + fVar72 * 0.0 + fVar46 * 0.0 + fVar58 * 0.0;
      auVar28 = vaddps_avx512vl(auVar62,auVar28);
      auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)fStack_310));
      auVar28 = vaddps_avx512vl(auVar28,auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(uStack_314));
      auVar35._0_4_ = fVar49 + fVar67 * fVar45 + fVar65 * fVar75 + view::viewMat._40_4_ * fVar47;
      auVar35._4_4_ = fVar50 + fVar81 * fVar45 + fVar68 * fVar75 + view::viewMat._44_4_ * fVar47;
      auVar35._8_4_ = fVar54 + fVar45 * 0.0 + fVar75 * 0.0 + fVar47 * 0.0;
      auVar35._12_4_ = fVar63 + fVar45 * 0.0 + fVar75 * 0.0 + fVar47 * 0.0;
      auVar42 = vinsertf32x4_avx512f(ZEXT1664(auVar28),auVar35,1);
      auVar28 = vmulps_avx512vl(auVar85,auVar29);
      auVar86._4_4_ = local_30c;
      auVar86._0_4_ = local_30c;
      auVar86._8_4_ = local_30c;
      auVar86._12_4_ = local_30c;
      auVar14 = vmulps_avx512vl(auVar64,auVar37);
      auVar37 = vmulps_avx512vl(auVar84,auVar37);
      auVar29 = vmulps_avx512vl(auVar66,auVar29);
      auVar19 = vmulps_avx512vl(auVar87,auVar86);
      auVar52._0_4_ =
           fVar67 * afStack_340[10] + auVar14._0_4_ + auVar29._0_4_ +
           view::viewMat._56_4_ * local_30c;
      auVar52._4_4_ =
           fVar81 * afStack_340[10] + auVar14._4_4_ + auVar29._4_4_ +
           view::viewMat._60_4_ * local_30c;
      auVar52._8_4_ = afStack_340[10] * 0.0 + auVar14._8_4_ + auVar29._8_4_ + local_30c * 0.0;
      auVar52._12_4_ = afStack_340[10] * 0.0 + auVar14._12_4_ + auVar29._12_4_ + local_30c * 0.0;
      auVar43 = vbroadcasti64x4_avx512f(_DAT_0029b3a0);
      auVar44 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412(auVar19._12_4_ +
                                              auVar28._12_4_ +
                                              auVar37._12_4_ + afStack_340[10] * 0.0,
                                              CONCAT48(auVar19._8_4_ +
                                                       auVar28._8_4_ +
                                                       auVar37._8_4_ + afStack_340[10] * 0.0,
                                                       CONCAT44(auVar19._4_4_ +
                                                                auVar28._4_4_ +
                                                                auVar37._4_4_ +
                                                                view::viewMat._4_4_ *
                                                                afStack_340[10],
                                                                auVar19._0_4_ +
                                                                auVar28._0_4_ +
                                                                auVar37._0_4_ +
                                                                (float)view::viewMat *
                                                                afStack_340[10])))),auVar52,1);
      auVar42 = vpermi2pd_avx512f(auVar43,auVar42,auVar44);
      auVar43 = vinsertf32x4_avx512f(ZEXT1664(auVar18),auVar60,1);
      auVar44 = vinsertf32x4_avx512f(ZEXT1664(auVar27),auVar79,1);
      auVar41 = vpermi2pd_avx512vl(_DAT_0029b3c0,auVar44._0_32_,auVar43._0_32_);
      _viewMat = vinsertf64x4_avx512f(auVar42,auVar41,0);
      auVar42 = ZEXT1664(auVar44._0_16_);
      (*engine->_vptr_Engine[10])(engine,0);
      (*engine->_vptr_Engine[0xb])(engine,7);
      drawStructures();
      (*engine->_vptr_Engine[0xb])(engine,7);
      (*((this->blurFrameBuffers)._M_elems[0].
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      (*((this->copyTexProgram).
         super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_ShaderProgram[0x1e])();
      iVar6 = options::shadowBlurIters;
      iVar7 = Engine::getSSAAFactor(engine);
      auVar55 = auVar42._4_12_;
      iVar7 = iVar7 * iVar6;
      if (0 < iVar7) {
        do {
          (*((this->blurFrameBuffers)._M_elems[1].
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_FrameBuffer[3])();
          peVar2 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_238[0] = local_228;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"t_image","");
          (*peVar2->_vptr_ShaderProgram[0x1a])
                    (peVar2,(string *)local_238,
                     (this->blurColorTextures)._M_elems[0].
                     super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          if (local_238[0] != local_228) {
            operator_delete(local_238[0]);
          }
          peVar2 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_258[0] = local_248;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"u_horizontal","");
          (*peVar2->_vptr_ShaderProgram[3])(peVar2,(string *)local_258,1);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0]);
          }
          (*((this->blurProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_ShaderProgram[0x1e])();
          (*((this->blurFrameBuffers)._M_elems[0].
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_FrameBuffer[3])();
          peVar2 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_278[0] = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"t_image","");
          (*peVar2->_vptr_ShaderProgram[0x1a])
                    (peVar2,(string *)local_278,
                     (this->blurColorTextures)._M_elems[1].
                     super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          if (local_278[0] != local_268) {
            operator_delete(local_278[0]);
          }
          peVar2 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_298[0] = local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"u_horizontal","");
          (*peVar2->_vptr_ShaderProgram[3])(peVar2,(string *)local_298,0);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0]);
          }
          (*((this->blurProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_ShaderProgram[0x1e])();
          auVar55 = auVar42._4_12_;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      DAT_004bd698 = uStack_70;
      view::viewMat = local_78;
      DAT_004bd6a0 = uStack_68;
      DAT_004bd6a8 = uStack_60;
      DAT_004bd6b0 = uStack_58;
      DAT_004bd6b8 = uStack_50;
      DAT_004bd6c0 = uStack_48;
      DAT_004bd6c8 = uStack_40;
    }
    auVar56 = ZEXT1260(auVar55);
    (*engine->_vptr_Engine[6])();
    (*engine->_vptr_Engine[0x24])();
    if (options::transparencyMode != 1) {
      (*engine->_vptr_Engine[0xb])(engine,7);
    }
    view::getCameraViewMatrix();
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1e8 = 0x614d776569765f75;
    local_1e0 = 0x78697274;
    local_1f0 = 0xc;
    local_1dc = 0;
    local_1f8 = &local_1e8;
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,&local_1f8,&local_78);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    view::getCameraPerspectiveMatrix();
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_208 = 0x614d6a6f72705f75;
    local_200 = 0x78697274;
    local_210 = 0xc;
    local_1fc = 0;
    local_218 = &local_208;
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,&local_218,&local_348);
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_88 = 0x6569765f75;
    uStack_83 = 0x6f7077;
    uStack_80 = 0x6d69447472;
    local_90 = 0xd;
    local_7b = 0;
    auVar57 = ZEXT856((ulong)local_188._8_8_);
    local_98 = &local_88;
    (*peVar2->_vptr_ShaderProgram[8])(local_188._0_8_,peVar2,&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (options::groundPlaneMode - 1U < 2) {
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_a8 = 0x7265746e65635f75;
      local_b0 = 8;
      local_a0 = 0;
      local_b8 = &local_a8;
      (*peVar2->_vptr_ShaderProgram[9])(state::center,(ulong)DAT_004bad68,peVar2,&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_c8 = 0x5873697361625f75;
      local_d0 = 8;
      local_c0 = 0;
      local_d8 = &local_c8;
      (*peVar2->_vptr_ShaderProgram[9])(local_2a8._0_8_,local_2b8._0_8_,peVar2,&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_e8 = 0x5973697361625f75;
      local_f0 = 8;
      local_e0 = 0;
      auVar57 = ZEXT856((ulong)local_2c8._8_8_);
      auVar56 = ZEXT1260(local_2d8._4_12_);
      local_f8 = &local_e8;
      (*peVar2->_vptr_ShaderProgram[9])(local_2c8._0_8_,local_2d8._0_8_,peVar2,&local_f8);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
    }
    if (options::groundPlaneMode == 3) {
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_1c8 = (undefined6 *)0x10;
      local_1a8 = local_198;
      local_1a8 = (undefined6 **)
                  std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_1c8);
      auVar43._8_56_ = extraout_var;
      auVar43._0_8_ = extraout_XMM1_Qa;
      auVar56 = auVar43._4_60_;
      local_198[0] = local_1c8;
      *local_1a8 = (undefined6 *)0x776f646168735f75;
      local_1a8[1] = (undefined6 *)0x7373656e6b726144;
      local_1a0 = local_1c8;
      *(char *)((long)local_1a8 + (long)local_1c8) = '\0';
      auVar57 = (undefined1  [56])0x0;
      (*peVar2->_vptr_ShaderProgram[5])((ulong)options::shadowDarkness,peVar2);
      if (local_1a8 != local_198) {
        operator_delete(local_1a8);
      }
    }
    vVar89 = view::getCameraWorldPosition();
    auVar53._0_4_ = vVar89.field_2;
    auVar53._4_60_ = auVar56;
    auVar44._0_8_ = vVar89._0_8_;
    auVar44._8_56_ = auVar57;
    uVar48 = auVar53._0_8_;
    if ((local_39c != 2) && (uVar48 = auVar44._0_8_, local_39c == 1)) {
      auVar18 = vmovshdup_avx(auVar44._0_16_);
      uVar48 = auVar18._0_8_;
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b8 = 0x656d61635f75;
    uStack_1b2 = 0x6172;
    uStack_1b0 = 0x746867696548;
    local_1c0 = 0xe;
    local_1aa = 0;
    local_1c8 = &local_1b8;
    (*peVar2->_vptr_ShaderProgram[5])(uVar48,peVar2,&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_108 = 0x6e67695370755f75;
    local_110 = 8;
    local_100 = 0;
    local_118 = &local_108;
    (*peVar2->_vptr_ShaderProgram[5])(local_1d8._0_8_,peVar2,&local_118);
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_128 = 0x5a73697361625f75;
    local_130 = 8;
    local_120 = 0;
    local_138 = &local_128;
    (*peVar2->_vptr_ShaderProgram[9])(local_390,local_308._0_8_,peVar2,&local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_148 = 0x756f72675f75;
    uStack_142 = 0x646e;
    uStack_140 = 0x746867696548;
    local_150 = 0xe;
    local_13a = 0;
    local_158 = &local_148;
    (*peVar2->_vptr_ShaderProgram[6])(dVar51,peVar2,&local_158);
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_168 = 0x6e656c5f75;
    uStack_163 = 0x687467;
    uStack_160 = 0x656c616353;
    local_170 = 0xd;
    local_15b = 0;
    local_178 = &local_168;
    (*peVar2->_vptr_ShaderProgram[6])(state::lengthScale,peVar2,&local_178);
    if (local_178 != &local_168) {
      operator_delete(local_178);
    }
    (*((this->groundPlaneProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void GroundPlane::draw(bool isRedraw) {
  if (options::groundPlaneMode == GroundPlaneMode::None) {
    return;
  }

  // don't draw ground in planar mode
  if (view::style == view::NavigateStyle::Planar) return;

  if (!groundPlanePrepared) {
    prepare();
  }
  if (view::upDir != groundPlaneViewCached) {
    populateGroundPlaneGeometry();
  }

  // Get logical "up" direction to which the ground plane is oriented
  int iP;
  float sign;
  std::tie(iP, sign) = getGroundPlaneAxisAndSign();

  glm::vec3 baseUp{0., 0., 0.};
  glm::vec3 baseForward{0., 0., 0.};
  glm::vec3 baseRight{0., 0., 0.};
  baseUp[iP] = 1.;
  baseForward[(iP + 1) % 3] = sign;
  baseRight[(iP + 2) % 3] = sign;

  // Location for ground plane
  double bboxBottom = sign == 1.0 ? std::get<0>(state::boundingBox)[iP] : std::get<1>(state::boundingBox)[iP];
  double bboxHeight = std::get<1>(state::boundingBox)[iP] - std::get<0>(state::boundingBox)[iP];
  double heightEPS = state::lengthScale * 1e-4;
  double groundHeight = bboxBottom - sign * (options::groundPlaneHeightFactor.asAbsolute() + heightEPS);

  // Viewport
  glm::vec4 viewport = render::engine->getCurrentViewport();
  glm::vec2 viewportDim{viewport[2], viewport[3]};
  int factor = render::engine->getSSAAFactor();

  auto setUniforms = [&]() {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    groundPlaneProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));

    glm::mat4 projMat = view::getCameraPerspectiveMatrix();
    groundPlaneProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
    groundPlaneProgram->setUniform("u_viewportDim", viewportDim);

    if (options::groundPlaneMode == GroundPlaneMode::Tile ||
        options::groundPlaneMode == GroundPlaneMode::TileReflection) {
      groundPlaneProgram->setUniform("u_center", state::center);
      groundPlaneProgram->setUniform("u_basisX", baseForward);
      groundPlaneProgram->setUniform("u_basisY", baseRight);
    }

    if (options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {
      groundPlaneProgram->setUniform("u_shadowDarkness", options::shadowDarkness);
    }

    float camHeight = view::getCameraWorldPosition()[iP];
    groundPlaneProgram->setUniform("u_cameraHeight", camHeight);
    groundPlaneProgram->setUniform("u_upSign", sign);
    groundPlaneProgram->setUniform("u_basisZ", baseUp);
    groundPlaneProgram->setUniform("u_groundHeight", groundHeight);
    groundPlaneProgram->setUniform("u_lengthScale", state::lengthScale);
  };

  /*
  // For all effects which will use the alternate scene buffers, prepare them
  if (options::groundPlaneMode == GroundPlaneMode::TileReflection ||
      options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {


    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();
  }
  */

  // Render the scene to implement the mirror effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::TileReflection) {

    // Prepare the alternate scene buffers
    // (use a texture 1/4 the area of the view buffer, it's supposed to be blurry anyway and this saves perf)
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a reflected view matrix
    glm::mat4 origViewMat = view::viewMat;

    glm::vec3 mirrorN = baseUp * sign;
    glm::mat3 mirrorMat3 = glm::mat3(1.0) - 2.0f * glm::outerProduct(mirrorN, mirrorN);
    glm::vec3 tVec{0., 0., 0.};
    tVec[iP] = -groundHeight;
    glm::mat4 mirrorMat =
        glm::translate(glm::mat4(1.0), -tVec) * glm::mat4(mirrorMat3) * glm::translate(glm::mat4(1.0), tVec);
    view::viewMat = view::viewMat * mirrorMat;

    // Draw everything
    if (!render::engine->transparencyEnabled()) { // skip when transparency is turned on
      drawStructures();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  // Render the scene to implement the shadow effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {

    // Prepare the alternate scene buffers
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth, factor * view::bufferHeight);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth, factor * view::bufferHeight);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Make sure all framebuffers are the right shape
    for (int i = 0; i < 2; i++) {
      blurFrameBuffers[i]->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->clear();
    }

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a view matrix which projects on to the ground plane
    glm::mat4 origViewMat = view::viewMat;
    glm::mat4 projMat = glm::mat4(1.0);
    projMat[iP][iP] = 0.;
    projMat[3][iP] = groundHeight;
    view::viewMat = view::viewMat * projMat;

    // Draw everything
    render::engine->setDepthMode();
    render::engine->setBlendMode(BlendMode::Disable);
    drawStructures();

    // Copy the depth buffer to a texture (while upsampling)
    render::engine->setBlendMode(BlendMode::Disable);
    blurFrameBuffers[0]->bindForRendering();
    copyTexProgram->draw();

    // == Blur

    // Do some blur iterations (ends in same buffer it started in)
    int nBlur = options::shadowBlurIters * render::engine->getSSAAFactor();
    // int nBlur = 0;
    for (int i = 0; i < nBlur; i++) {
      // horizontal blur
      blurFrameBuffers[1]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[0].get());
      blurProgram->setUniform("u_horizontal", 1);
      blurProgram->draw();

      // vertical blur
      blurFrameBuffers[0]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[1].get());
      blurProgram->setUniform("u_horizontal", 0);
      blurProgram->draw();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  render::engine->bindSceneBuffer();

  // Render the ground plane
  render::engine->applyTransparencySettings();
  if (options::transparencyMode != TransparencyMode::Simple) {
    render::engine->setBlendMode(BlendMode::Disable);
  }
  setUniforms();
  groundPlaneProgram->draw();
}